

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# _tree.hpp
# Opt level: O1

void __thiscall
ft::RBTree<int,_ft::allocator<ft::treeNode<int>_>_>::treeInit
          (RBTree<int,_ft::allocator<ft::treeNode<int>_>_> *this)

{
  treeNode<int> *ptVar1;
  treeNode<int> *ptVar2;
  treeNode<int> *ptVar3;
  
  ptVar2 = (treeNode<int> *)operator_new(0x20);
  this->NIL = ptVar2;
  ptVar2 = (treeNode<int> *)operator_new(0x20);
  this->m_first = ptVar2;
  ptVar3 = (treeNode<int> *)operator_new(0x20);
  this->m_last = ptVar3;
  ptVar2 = this->NIL;
  ptVar2->value = 0;
  ptVar2->colour = BLACK;
  ptVar2->left = (treeNode<int> *)0x0;
  ptVar2->right = (treeNode<int> *)0x0;
  ptVar2->parent = (treeNode<int> *)0x0;
  ptVar1 = this->m_first;
  ptVar1->value = 0;
  ptVar1->colour = BLACK;
  ptVar1->parent = (treeNode<int> *)0x0;
  ptVar1->left = (treeNode<int> *)0x0;
  ptVar1->right = (treeNode<int> *)0x0;
  ptVar3->value = 0;
  ptVar3->colour = BLACK;
  ptVar3->left = (treeNode<int> *)0x0;
  ptVar3->right = (treeNode<int> *)0x0;
  ptVar3->parent = (treeNode<int> *)0x0;
  ptVar2->parent = ptVar2;
  ptVar2->left = ptVar2;
  ptVar2->right = ptVar2;
  ptVar1->left = ptVar2;
  ptVar1->right = ptVar2;
  ptVar3->left = ptVar2;
  ptVar3->right = ptVar2;
  this->m_root = ptVar2;
  return;
}

Assistant:

void treeInit() {
		this->NIL = this->m_alloc.allocate(1);
		this->m_first = this->m_alloc.allocate(1);
		this->m_last = this->m_alloc.allocate(1);

		this->m_alloc.construct(this->NIL, BLACK);
		this->m_alloc.construct(this->m_first, BLACK);
		this->m_alloc.construct(this->m_last, BLACK);

		this->NIL->parent = this->NIL;
		this->NIL->left = this->NIL;
		this->NIL->right = this->NIL;
		this->m_first->left = this->NIL;
		this->m_first->right = this->NIL;
		this->m_last->left = this->NIL;
		this->m_last->right = this->NIL;

		this->m_root = this->NIL;
	}